

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

uint16_t elf_getshndx(GlobalVars *gv,Symbol *sym,uint8_t symtype)

{
  byte in_DL;
  long in_RSI;
  long in_RDI;
  uint16_t shndx;
  uint16_t local_14;
  
  local_14 = 0;
  switch(*(undefined1 *)(in_RSI + 0x40)) {
  case 1:
    local_14 = 0xfff1;
    break;
  case 2:
    if (2 < in_DL) {
      ierror("elf_getshndx(): %s is relocatable, but not a function or object (type %d)",
             *(undefined8 *)(in_RSI + 0x20),(ulong)in_DL);
    }
    local_14 = (uint16_t)*(undefined4 *)(*(long *)(*(long *)(in_RSI + 0x38) + 0x18) + 0x10);
    break;
  case 3:
    local_14 = 0xfff2;
    break;
  case 4:
    error(0x21,fff[*(byte *)(in_RDI + 0x58)]->tname,*(undefined8 *)(in_RSI + 0x20),
          sym_bind[*(byte *)(in_RSI + 0x43)],sym_type[*(byte *)(in_RSI + 0x40)],
          sym_info[*(byte *)(in_RSI + 0x42)]);
  case 0:
    local_14 = 0;
    break;
  default:
    ierror("elf_getshndx(): Illegal symbol type: %d",(ulong)*(byte *)(in_RSI + 0x40));
  }
  return local_14;
}

Assistant:

uint16_t elf_getshndx(struct GlobalVars *gv,
                      struct Symbol *sym,uint8_t symtype)
{
  uint16_t shndx = SHN_UNDEF;

  switch (sym->type) {
    case SYM_INDIR:
      /* can't reproduce unsupported symbol type */
      error(33,fff[gv->dest_format]->tname,sym->name,sym_bind[sym->bind],
            sym_type[sym->type],sym_info[sym->info]);
    case SYM_UNDEF:
      shndx = SHN_UNDEF;
      break;
    case SYM_ABS:
      shndx = SHN_ABS;
      break;
    case SYM_RELOC:
      if (symtype > STT_FUNC)
        ierror("elf_getshndx(): %s is relocatable, but not a "
               "function or object (type %d)",sym->name,(int)symtype);
      shndx = (uint16_t)sym->relsect->lnksec->index;
      break;
    case SYM_COMMON:
      shndx = SHN_COMMON;
      break;
    default:
      ierror("elf_getshndx(): Illegal symbol type: %d",(int)sym->type);
      break;
  }
  return shndx;
}